

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane::~IfcCurveBoundedPlane
          (IfcCurveBoundedPlane *this,void **vtt)

{
  void **vtt_local;
  IfcCurveBoundedPlane *this_local;
  
  (this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcBoundedSurface).super_IfcSurface.
                    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcBoundedSurface).super_IfcSurface.
                  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                  _vptr_ObjectHelper[0xfffffffffffffffd]) = vtt[0x19];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x1a];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x1b];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
             field_0x30 = vtt[0x1c];
  *(void **)&(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40 = vtt[0x1d];
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>,_0UL,_0UL>::~ListOf
            (&this->InnerBoundaries);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane,_3UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCurveBoundedPlane,_3UL> *)
             &(this->super_IfcBoundedSurface).super_IfcSurface.field_0x40,vtt + 0x17);
  IfcBoundedSurface::~IfcBoundedSurface(&this->super_IfcBoundedSurface,vtt + 1);
  return;
}

Assistant:

IfcCurveBoundedPlane() : Object("IfcCurveBoundedPlane") {}